

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_switch.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  Color in_ECX;
  overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:74:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:77:5)>
  *f;
  overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:74:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:77:5)>
  *f_00;
  Color in_ESI;
  allocator<char> local_79;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_78;
  bool local_58;
  _Storage<const_char_*,_true> local_50;
  size_type local_48;
  undefined1 local_40 [8];
  undefined8 uStack_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> empty;
  
  magic_enum::
  enum_switch<magic_enum::detail::default_result_type,Color,(magic_enum::detail::enum_subtype)0,main::__0&,void>
            ((anon_class_1_0_00000001 *)0x0,in_ESI);
  magic_enum::
  enum_switch<magic_enum::detail::default_result_type,Color,(magic_enum::detail::enum_subtype)0,main::__0&,void>
            ((anon_class_1_0_00000001 *)0x2,in_ESI);
  magic_enum::
  enum_switch<magic_enum::detail::default_result_type,Color,(magic_enum::detail::enum_subtype)0,overloaded<main::__1,main::__2>&,void>
            ((overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:60:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:63:5)>
              *)0x1,in_ESI);
  magic_enum::
  enum_switch<magic_enum::detail::default_result_type,Color,(magic_enum::detail::enum_subtype)0,overloaded<main::__1,main::__2>&,void>
            ((overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:60:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:63:5)>
              *)0x0,in_ESI);
  magic_enum::
  enum_switch<std::__cxx11::string,Color,(magic_enum::detail::enum_subtype)0,overloaded<main::__3,main::__4>&,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
             (magic_enum *)0x2,f,in_ECX);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_78);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_78);
  magic_enum::
  enum_switch<std::__cxx11::string,Color,(magic_enum::detail::enum_subtype)0,overloaded<main::__3,main::__4>&,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
             (magic_enum *)0x0,f_00,in_ECX);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_78);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_78);
  empty._M_dataplus._M_p = (pointer)&empty.field_2;
  empty._M_string_length = 0;
  empty.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"unrecognized",&local_79);
  local_78._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_78._M_value + 0x10);
  if (local_50._M_value == local_40) {
    local_78._24_8_ = uStack_38;
  }
  else {
    local_78._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)local_50;
  }
  local_78._M_value._M_string_length = local_48;
  local_48 = 0;
  local_40[0] = 0;
  local_50._M_value = local_40;
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_78);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_50);
  *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) | 1;
  local_50._M_value = "cica";
  local_48 = CONCAT71(local_48._1_7_,1);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<const_char_*,_true>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_78,(optional<const_char_*> *)&local_50);
  if (local_58 != false) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_78);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_78);
    std::_Optional_payload_base<std::__cxx11::string>::_Optional_payload_base<char_const(&)[11]>
              ((_Optional_payload_base<std::__cxx11::string> *)&local_78,"red result");
    if (local_58 != false) {
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_78);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78);
      local_58 = false;
      poVar1 = std::ostream::_M_insert<bool>(true);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78);
      std::__cxx11::string::~string((string *)&empty);
      return 0;
    }
    std::__throw_bad_optional_access();
  }
  std::__throw_bad_optional_access();
}

Assistant:

int main() {
  Color c = Color::RED;

  auto lambda = [] (auto value) {
    std::cout << DoWork<value>() << std::endl;
  };

  magic_enum::enum_switch(lambda, c); // prints "default"

  c = Color::GREEN;

  magic_enum::enum_switch(lambda, c); // prints "override"

  // with object, explicit enum type
  auto switcher1 = overloaded{
    [] (magic_enum::enum_constant<Color::BLUE>) {
      std::cout << "Blue" << std::endl;
    },
    [] (magic_enum::enum_constant<Color::RED>) {
      std::cout << "Red" << std::endl;
    }
  };

  magic_enum::enum_switch(switcher1, Color::GREEN); // prints nothing
  magic_enum::enum_switch(switcher1, Color::BLUE); // prints "Blue"
  magic_enum::enum_switch(switcher1, Color::RED); // prints "Red"

  // explicit result type
  auto switcher2 = overloaded{
    [] (magic_enum::enum_constant<Color::GREEN>) {
      return "called with green argument";
    },
    [] (Color other) { // default case
      auto name = magic_enum::enum_name(other); // not empty
      return "default: " + std::string{name};
    }
  };

  std::cout << magic_enum::enum_switch<std::string>(switcher2, Color::GREEN) << std::endl; // prints "called with green argument"
  std::cout << magic_enum::enum_switch<std::string>(switcher2, Color::RED) << std::endl; // prints "default: RED"

  auto empty = magic_enum::enum_switch<std::string>(switcher2, static_cast<Color>(-3)); // returns an empty string
  assert(empty.empty());

  // result with default object
  std::cout << magic_enum::enum_switch<std::string>(switcher2, static_cast<Color>(-3), "unrecognized") << std::endl; // prints "unrecognized"

  auto switcher3 = overloaded{
    [] (magic_enum::enum_constant<Color::RED>) -> std::optional<std::string> {
      return "red result";
    },
    [] (magic_enum::enum_constant<Color::BLUE>) -> std::optional<std::string> {
      return std::nullopt;
    }
  };

  std::cout << std::boolalpha;
  std::cout << magic_enum::enum_switch(switcher3, Color::GREEN, std::make_optional("cica")).value() << std::endl; // prints default: "cica"
  std::cout << magic_enum::enum_switch(switcher3, Color::RED, std::make_optional("cica")).value() << std::endl; // prints: "red result"
  std::cout << magic_enum::enum_switch(switcher3, Color::BLUE, std::make_optional("cica")).has_value() << std::endl; // prints: false

  return 0;
}